

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrom.cpp
# Opt level: O2

uint8_t __thiscall n_e_s::core::Nrom::ppu_read_byte(Nrom *this,uint16_t addr)

{
  uchar *puVar1;
  pair<int,_unsigned_short> pVar2;
  
  if (addr < 0x2000) {
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->chr_rom_,(ulong)addr);
  }
  else {
    pVar2 = translate_nametable_addr(this,addr,(this->super_IRom).header_.flags_6 & Vertical);
    puVar1 = (this->nametables_)._M_elems[pVar2.first]._M_elems + ((ulong)pVar2 >> 0x20 & 0xffff);
  }
  return *puVar1;
}

Assistant:

uint8_t Nrom::ppu_read_byte(uint16_t addr) const {
    if (addr <= kChrEnd) {
        return chr_rom_.at(addr);
    }
    const auto [index, addr_mod] =
            translate_nametable_addr(addr, header().mirroring());
    return nametables_[index][addr_mod];
}